

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void ZopfliInitOptions(ZopfliOptions *options)

{
  ZopfliOptions *options_local;
  
  options->verbose = 0;
  options->verbose_more = 0;
  options->numiterations = 0xf;
  options->blocksplitting = 1;
  options->blocksplittinglast = 0;
  options->blocksplittingmax = 0xf;
  return;
}

Assistant:

void ZopfliInitOptions(ZopfliOptions* options) {
  options->verbose = 0;
  options->verbose_more = 0;
  options->numiterations = 15;
  options->blocksplitting = 1;
  options->blocksplittinglast = 0;
  options->blocksplittingmax = 15;
}